

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O2

_Bool cf_socket_data_pending(Curl_cfilter *cf,Curl_easy *data)

{
  void *pvVar1;
  _Bool _Var2;
  _Bool _Var3;
  int iVar4;
  
  pvVar1 = cf->ctx;
  _Var2 = Curl_bufq_is_empty((bufq *)((long)pvVar1 + 0xa0));
  _Var3 = true;
  if (_Var2) {
    iVar4 = Curl_socket_check(*(curl_socket_t *)((long)pvVar1 + 0x98),-1,-1,0);
    _Var3 = (_Bool)((byte)iVar4 & 0 < iVar4);
  }
  return _Var3;
}

Assistant:

static bool cf_socket_data_pending(struct Curl_cfilter *cf,
                                   const struct Curl_easy *data)
{
  struct cf_socket_ctx *ctx = cf->ctx;
  int readable;

  (void)data;
  if(!Curl_bufq_is_empty(&ctx->recvbuf))
    return TRUE;

  readable = SOCKET_READABLE(ctx->sock, 0);
  return (readable > 0 && (readable & CURL_CSELECT_IN));
}